

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

void __thiscall QToolButton::setMenu(QToolButton *this,QMenu *menu)

{
  QWeakPointer<QObject> *this_00;
  long lVar1;
  bool bVar2;
  QAction *pQVar3;
  QAction *pQVar4;
  
  lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  this_00 = (QWeakPointer<QObject> *)(lVar1 + 0x2c8);
  if (menu == (QMenu *)0x0) {
    pQVar3 = (QAction *)0x0;
  }
  else {
    pQVar3 = QMenu::menuAction(menu);
  }
  if ((this_00->d == (Data *)0x0) || (*(int *)(this_00->d + 4) == 0)) {
    pQVar4 = (QAction *)0x0;
  }
  else {
    pQVar4 = *(QAction **)(lVar1 + 0x2d0);
  }
  if (pQVar4 != pQVar3) {
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (bVar2) {
      if ((this_00->d == (Data *)0x0) || (*(int *)(this_00->d + 4) == 0)) {
        pQVar3 = (QAction *)0x0;
      }
      else {
        pQVar3 = *(QAction **)(lVar1 + 0x2d0);
      }
      QWidget::removeAction((QWidget *)this,pQVar3);
    }
    if (menu == (QMenu *)0x0) {
      QWeakPointer<QObject>::assign<QObject>(this_00,(QObject *)0x0);
    }
    else {
      pQVar3 = QMenu::menuAction(menu);
      QWeakPointer<QObject>::assign<QObject>(this_00,(QObject *)pQVar3);
      if ((this_00->d == (Data *)0x0) || (*(int *)(this_00->d + 4) == 0)) {
        pQVar3 = (QAction *)0x0;
      }
      else {
        pQVar3 = *(QAction **)(lVar1 + 0x2d0);
      }
      QWidget::addAction((QWidget *)this,pQVar3);
    }
    *(undefined8 *)(lVar1 + 0x2ac) = 0xffffffffffffffff;
    QWidget::updateGeometry((QWidget *)this);
    QWidget::update((QWidget *)this);
    return;
  }
  return;
}

Assistant:

void QToolButton::setMenu(QMenu* menu)
{
    Q_D(QToolButton);

    if (d->menuAction == (menu ? menu->menuAction() : nullptr))
        return;

    if (d->menuAction)
        removeAction(d->menuAction);

    if (menu) {
        d->menuAction = menu->menuAction();
        addAction(d->menuAction);
    } else {
        d->menuAction = nullptr;
    }

    // changing the menu set may change the size hint, so reset it
    d->sizeHint = QSize();
    updateGeometry();
    update();
}